

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O1

void __thiscall
TEST_GROUP_CppUTestGroupJUnitOutputTest::setup(TEST_GROUP_CppUTestGroupJUnitOutputTest *this)

{
  JUnitTestOutput *this_00;
  TestResult *this_01;
  JUnitTestOutputTestRunner *this_02;
  
  CppUTestStore(&PlatformSpecificFOpen);
  PlatformSpecificFOpen = mockFOpen;
  CppUTestStore(&PlatformSpecificFPuts);
  PlatformSpecificFPuts = mockFPuts;
  CppUTestStore(&PlatformSpecificFClose);
  PlatformSpecificFClose = mockFClose;
  this_00 = (JUnitTestOutput *)
            operator_new(0x28,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/JUnitOutputTest.cpp"
                         ,0x158);
  JUnitTestOutput::JUnitTestOutput(this_00);
  this->junitOutput = this_00;
  this_01 = (TestResult *)
            operator_new(0x70,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/JUnitOutputTest.cpp"
                         ,0x159);
  TestResult::TestResult(this_01,&this->junitOutput->super_TestOutput);
  this->result = this_01;
  this_02 = (JUnitTestOutputTestRunner *)
            operator_new(0x98,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/JUnitOutputTest.cpp"
                         ,0x15a);
  JUnitTestOutputTestRunner::JUnitTestOutputTestRunner(this_02,this->result);
  this->testCaseRunner = this_02;
  return;
}

Assistant:

void setup() _override
    {
        UT_PTR_SET(PlatformSpecificFOpen, mockFOpen);
        UT_PTR_SET(PlatformSpecificFPuts, mockFPuts);
        UT_PTR_SET(PlatformSpecificFClose, mockFClose);
        junitOutput = new JUnitTestOutput();
        result = new TestResult(*junitOutput);
        testCaseRunner = new JUnitTestOutputTestRunner(*result);
    }